

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmarker.c
# Opt level: O3

void jinit_marker_reader(j_decompress_ptr cinfo)

{
  undefined4 *puVar1;
  jpeg_marker_reader *pjVar2;
  long lVar3;
  
  pjVar2 = (jpeg_marker_reader *)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,0,0x108);
  cinfo->marker = pjVar2;
  pjVar2->reset_marker_reader = reset_marker_reader;
  pjVar2->read_markers = read_markers;
  pjVar2->read_restart_marker = read_restart_marker;
  pjVar2[1].reset_marker_reader = skip_variable;
  *(undefined4 *)&pjVar2[4].read_restart_marker = 0;
  lVar3 = -0x20;
  do {
    puVar1 = (undefined4 *)((long)&pjVar2[4].read_restart_marker + lVar3 * 4);
    *puVar1 = 0x121631;
    puVar1[1] = 0;
    puVar1[2] = 0x121631;
    puVar1[3] = 0;
    *(undefined8 *)((long)&pjVar2[6].reset_marker_reader + lVar3 * 2 + 4) = 0;
    lVar3 = lVar3 + 4;
  } while (lVar3 != 0);
  pjVar2[1].read_markers = get_interesting_appn;
  pjVar2[4].reset_marker_reader = get_interesting_appn;
  pjVar2 = cinfo->marker;
  cinfo->comp_info = (jpeg_component_info *)0x0;
  cinfo->input_scan_number = 0;
  cinfo->unread_marker = 0;
  pjVar2->saw_SOI = 0;
  pjVar2->saw_SOF = 0;
  pjVar2->discarded_bytes = 0;
  pjVar2[6].read_markers = (_func_int_j_decompress_ptr *)0x0;
  return;
}

Assistant:

GLOBAL(void)
jinit_marker_reader(j_decompress_ptr cinfo)
{
  my_marker_ptr marker;
  int i;

  /* Create subobject in permanent pool */
  marker = (my_marker_ptr)
    (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_PERMANENT,
                                sizeof(my_marker_reader));
  cinfo->marker = (struct jpeg_marker_reader *)marker;
  /* Initialize public method pointers */
  marker->pub.reset_marker_reader = reset_marker_reader;
  marker->pub.read_markers = read_markers;
  marker->pub.read_restart_marker = read_restart_marker;
  /* Initialize COM/APPn processing.
   * By default, we examine and then discard APP0 and APP14,
   * but simply discard COM and all other APPn.
   */
  marker->process_COM = skip_variable;
  marker->length_limit_COM = 0;
  for (i = 0; i < 16; i++) {
    marker->process_APPn[i] = skip_variable;
    marker->length_limit_APPn[i] = 0;
  }
  marker->process_APPn[0] = get_interesting_appn;
  marker->process_APPn[14] = get_interesting_appn;
  /* Reset marker processing state */
  reset_marker_reader(cinfo);
}